

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTest.cpp
# Opt level: O0

void __thiscall Basic_Empty_Test::Basic_Empty_Test(Basic_Empty_Test *this)

{
  Basic_Empty_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Basic_Empty_Test_0018dc88;
  return;
}

Assistant:

TEST(Basic, Empty) {

    {
        CLI::App app;
        input_t simpleput;
        app.parse(simpleput);
    }
    {
        CLI::App app;
        input_t spare = {"spare"};
        EXPECT_THROW(app.parse(spare), CLI::ExtrasError);
    }
    {
        CLI::App app;
        input_t simpleput;
        app.parse(simpleput);
    }
}